

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseSingleValue(Parser *this,string *name,Value *e,bool check_now)

{
  int iVar1;
  Value *pVVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  undefined7 in_register_00000009;
  byte in_R8B;
  undefined4 in_stack_fffffffffffffbfc;
  char *local_358;
  double local_300;
  double val_12;
  float local_2f0;
  byte local_2e9;
  float val_11;
  uint64_t val_10;
  long local_2d8;
  int64_t val_9;
  uint local_2c8;
  byte local_2c1;
  uint32_t val_8;
  byte local_2b9;
  int32_t val_7;
  short local_2b4;
  byte local_2b2;
  uchar local_2b1;
  uint16_t val_6;
  byte local_2ae;
  uchar local_2ad;
  int16_t val_5;
  byte local_2aa;
  uint8_t val_4;
  int8_t val_3;
  BaseType BStack_2a8;
  uint8_t val_2;
  uint8_t val_1;
  uint8_t val;
  BaseType match_type;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0 [8];
  string msg;
  string local_1b8 [34];
  byte local_196;
  byte local_195;
  byte local_194;
  byte local_193;
  byte local_192;
  byte local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  long local_170;
  size_type last_non_ws;
  undefined1 local_160 [5];
  bool is_true;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  byte local_71;
  int local_70;
  byte local_6b;
  byte local_6a;
  undefined1 local_69;
  int kTokenStringOrIdent;
  bool match;
  bool is_tok_string;
  bool is_tok_ident;
  BaseType in_type;
  uint local_40;
  byte local_2b;
  char local_2a;
  byte local_29;
  char sign;
  Value *pVStack_28;
  bool check_now_local;
  Value *e_local;
  string *name_local;
  Parser *this_local;
  CheckedError *ce;
  
  pVStack_28 = (Value *)CONCAT71(in_register_00000009,check_now);
  local_29 = in_R8B & 1;
  e_local = e;
  name_local = name;
  this_local = this;
  if ((*(int *)((long)&name->field_2 + 0xc) == 0x2b) ||
     (*(int *)((long)&name->field_2 + 0xc) == 0x2d)) {
    local_2a = (name->field_2)._M_local_buf[0xc];
    local_2b = 0;
    Next(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_2b = 1;
    }
    local_40 = (uint)bVar3;
    if ((local_2b & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_40 != 0) goto LAB_00113d1b;
    if (*(int *)((long)&name->field_2 + 0xc) != 0x104) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in_type,"constant name expected",(allocator<char> *)&is_tok_ident);
      Error(this,name);
      std::__cxx11::string::~string((string *)&in_type);
      std::allocator<char>::~allocator((allocator<char> *)&is_tok_ident);
      goto LAB_00113d1b;
    }
    std::__cxx11::string::insert((ulong)&name[1]._M_string_length,0,'\x01');
  }
  kTokenStringOrIdent = (pVStack_28->type).base_type;
  local_69 = *(int *)((long)&name->field_2 + 0xc) == 0x104;
  local_6a = *(int *)((long)&name->field_2 + 0xc) == 0x101;
  if (((bool)local_69) && (*(char *)name->_M_string_length == '(')) {
    ParseFunction(this,name,e_local);
    goto LAB_00113d1b;
  }
  local_6b = 0;
  if (((bool)local_69) || ((bool)local_6a)) {
    local_70 = *(int *)((long)&name->field_2 + 0xc);
    if ((*(int *)((long)&name->field_2 + 0xc) == 0x101) && (kTokenStringOrIdent == BASE_TYPE_STRING)
       ) {
      local_71 = 0;
      TryTypedValue(this,name,(int)e_local,true,(Value *)0x1,(BaseType)pVStack_28,
                    (bool *)CONCAT44(in_stack_fffffffffffffbfc,0xd));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_71 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_71 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
    }
    if (((((local_6b & 1) == 0) && ((local_6a & 1) != 0)) &&
        (bVar3 = IsScalar(kTokenStringOrIdent), bVar3)) && (((byte)name[1]._M_dataplus & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,
                 "type mismatch or invalid value, an initializer of non-string field must be trivial ASCII string: type: "
                 ,&local_139);
      pcVar5 = TypeName(kTokenStringOrIdent);
      std::operator+(&local_118,&local_138,pcVar5);
      std::operator+(&local_f8,&local_118,", name: ");
      last_non_ws._6_1_ = 0;
      if (e_local == (Value *)0x0) {
        std::allocator<char>::allocator();
        last_non_ws._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_160,"",(allocator<char> *)((long)&last_non_ws + 7));
      }
      else {
        std::__cxx11::string::string((string *)local_160,(string *)e_local);
      }
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::operator+(&local_b8,&local_d8,", value: ");
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &name[1]._M_string_length);
      Error(this,name);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)local_160);
      if ((last_non_ws._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&last_non_ws + 7));
      }
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      goto LAB_00113d1b;
    }
    if ((((local_6b & 1) == 0) && (bVar3 = IsBool(kTokenStringOrIdent), bVar3)) &&
       ((last_non_ws._5_1_ =
              std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &name[1]._M_string_length,"true"), (bool)last_non_ws._5_1_ ||
        (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&name[1]._M_string_length,"false"), bVar3)))) {
      if ((last_non_ws._5_1_ & 1) == 0) {
        local_358 = "0";
      }
      else {
        local_358 = "1";
      }
      std::__cxx11::string::operator=((string *)&name[1]._M_string_length,local_358);
      if ((((local_6b & 1) == 0) && (local_70 == *(int *)((long)&name->field_2 + 0xc))) &&
         (bVar3 = IsBool(kTokenStringOrIdent), pVVar2 = e_local, iVar1 = local_70, bVar3)) {
        last_non_ws._4_1_ = 0;
        bVar3 = IsBool(kTokenStringOrIdent);
        TryTypedValue(this,name,(int)pVVar2,SUB41(iVar1,0),(Value *)(ulong)bVar3,
                      (BaseType)pVStack_28,(bool *)CONCAT44(in_stack_fffffffffffffbfc,2));
        bVar3 = CheckedError::Check((CheckedError *)this);
        if (bVar3) {
          last_non_ws._4_1_ = 1;
        }
        local_40 = (uint)bVar3;
        if ((last_non_ws._4_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_40 != 0) goto LAB_00113d1b;
      }
    }
    if ((((local_6b & 1) == 0) && (bVar3 = IsScalar(kTokenStringOrIdent), bVar3)) &&
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&name[1]._M_string_length,"null"), bVar3)) {
      std::__cxx11::string::operator=((string *)&pVStack_28->constant,"null");
      last_non_ws._3_1_ = 0;
      Next(this);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        last_non_ws._3_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if ((last_non_ws._3_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      local_6b = 1;
    }
    if ((((local_6b & 1) == 0) && (bVar3 = IsInteger(kTokenStringOrIdent), bVar3)) &&
       (bVar3 = IsBool(kTokenStringOrIdent), !bVar3)) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar3 = anon_unknown_0::IsIdentifierStart(*pcVar5);
      if (bVar3) {
        last_non_ws._2_1_ = 0;
        ParseEnumFromString(this,(Type *)name,(string *)pVStack_28);
        bVar3 = CheckedError::Check((CheckedError *)this);
        if (bVar3) {
          last_non_ws._2_1_ = 1;
        }
        local_40 = (uint)bVar3;
        if ((last_non_ws._2_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_40 != 0) goto LAB_00113d1b;
        last_non_ws._1_1_ = 0;
        Next(this);
        bVar3 = CheckedError::Check((CheckedError *)this);
        if (bVar3) {
          last_non_ws._1_1_ = 1;
        }
        local_40 = (uint)bVar3;
        if ((last_non_ws._1_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_40 != 0) goto LAB_00113d1b;
        local_6b = 1;
      }
    }
    if ((((local_6b & 1) == 0) && ((local_6a & 1) != 0)) &&
       (bVar3 = IsScalar(kTokenStringOrIdent), bVar3)) {
      local_170 = std::__cxx11::string::find_last_not_of((char)name + '(',0x20);
      if (local_170 != -1) {
        std::__cxx11::string::resize((ulong)&name[1]._M_string_length);
      }
      bVar3 = IsFloat((pVStack_28->type).base_type);
      if ((bVar3) &&
         (lVar4 = std::__cxx11::string::find_last_of((char)name + '(',0x29), lVar4 != -1)) {
        std::operator+(&local_190,"invalid number: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &name[1]._M_string_length);
        Error(this,name);
        std::__cxx11::string::~string((string *)&local_190);
        goto LAB_00113d1b;
      }
    }
    if ((((local_6b & 1) == 0) && (local_70 == *(int *)((long)&name->field_2 + 0xc))) &&
       (bVar3 = IsFloat(kTokenStringOrIdent), pVVar2 = e_local, iVar1 = local_70, bVar3)) {
      local_191 = 0;
      bVar3 = IsFloat(kTokenStringOrIdent);
      TryTypedValue(this,name,(int)pVVar2,SUB41(iVar1,0),(Value *)(ulong)bVar3,(BaseType)pVStack_28,
                    (bool *)CONCAT44(in_stack_fffffffffffffbfc,0xb));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_191 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_191 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
    }
    if ((((local_6b & 1) == 0) && (local_70 == *(int *)((long)&name->field_2 + 0xc))) &&
       (bVar3 = IsInteger(kTokenStringOrIdent), pVVar2 = e_local, iVar1 = local_70, bVar3)) {
      local_192 = 0;
      bVar3 = IsInteger(kTokenStringOrIdent);
      TryTypedValue(this,name,(int)pVVar2,SUB41(iVar1,0),(Value *)(ulong)bVar3,(BaseType)pVStack_28,
                    (bool *)CONCAT44(in_stack_fffffffffffffbfc,7));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_192 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_192 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
    }
    if ((((local_6b & 1) == 0) && (*(int *)((long)&name->field_2 + 0xc) == 0x101)) &&
       ((kTokenStringOrIdent == 0xd || (bVar3 = IsConstTrue<bool>(true), bVar3)))) {
      local_193 = 0;
      TryTypedValue(this,name,(int)e_local,true,(Value *)(ulong)(kTokenStringOrIdent == 0xd),
                    (BaseType)pVStack_28,(bool *)CONCAT44(in_stack_fffffffffffffbfc,0xd));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_193 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_193 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      goto joined_r0x00112c82;
    }
  }
  else {
    if ((*(int *)((long)&name->field_2 + 0xc) == 0x103) &&
       (bVar3 = IsFloat(kTokenStringOrIdent), pVVar2 = e_local, bVar3)) {
      local_194 = 0;
      bVar3 = IsFloat(kTokenStringOrIdent);
      TryTypedValue(this,name,(int)pVVar2,true,(Value *)(ulong)bVar3,(BaseType)pVStack_28,
                    (bool *)CONCAT44(in_stack_fffffffffffffbfc,0xb));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_194 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_194 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
    }
    if ((((local_6b & 1) == 0) && (*(int *)((long)&name->field_2 + 0xc) == 0x102)) &&
       ((bVar3 = IsScalar(kTokenStringOrIdent), bVar3 || (bVar3 = IsConstTrue<bool>(true), bVar3))))
    {
      pVVar2 = e_local;
      local_195 = 0;
      bVar3 = IsScalar(kTokenStringOrIdent);
      TryTypedValue(this,name,(int)pVVar2,true,(Value *)(ulong)bVar3,(BaseType)pVStack_28,
                    (bool *)CONCAT44(in_stack_fffffffffffffbfc,7));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_195 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_195 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
joined_r0x00112c82:
      if (local_40 != 0) goto LAB_00113d1b;
    }
  }
  if ((((local_6b & 1) == 0) && (bVar3 = IsVector(&pVStack_28->type), bVar3)) &&
     (*(int *)((long)&name->field_2 + 0xc) == 0x5b)) {
    local_196 = 0;
    Next(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_196 = 1;
    }
    local_40 = (uint)bVar3;
    if ((local_196 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_40 != 0) goto LAB_00113d1b;
    if (*(int *)((long)&name->field_2 + 0xc) != 0x5d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1b8,"Expected `]` in vector default",
                 (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      Error(this,name);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      goto LAB_00113d1b;
    }
    msg.field_2._M_local_buf[0xe] = '\0';
    Next(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      msg.field_2._M_local_buf[0xe] = '\x01';
    }
    local_40 = (uint)bVar3;
    if ((msg.field_2._M_local_buf[0xe] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_40 != 0) goto LAB_00113d1b;
    local_6b = 1;
    std::__cxx11::string::operator=((string *)&pVStack_28->constant,"[]");
  }
  if ((local_6b & 1) == 0) {
    std::__cxx11::string::string(local_1e0);
    TokenToStringId_abi_cxx11_(&local_280,(Parser *)name,*(int *)((long)&name->field_2 + 0xc));
    std::operator+(&local_260,"Cannot assign token starting with \'",&local_280);
    std::operator+(&local_240,&local_260,"\' to value of <");
    pcVar5 = TypeName(kTokenStringOrIdent);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&match_type,pcVar5,(allocator<char> *)&val);
    std::operator+(&local_220,&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match_type)
    ;
    std::operator+(&local_200,&local_220,"> type.");
    std::__cxx11::string::operator+=(local_1e0,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&match_type);
    std::allocator<char>::~allocator((allocator<char> *)&val);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    Error(this,name);
    local_40 = 1;
    std::__cxx11::string::~string(local_1e0);
    goto LAB_00113d1b;
  }
  BStack_2a8 = (pVStack_28->type).base_type;
  if ((((local_29 & 1) != 0) && (bVar3 = IsScalar(BStack_2a8), bVar3)) &&
     (bVar3 = std::operator!=(&pVStack_28->constant,"null"), bVar3)) {
    switch(BStack_2a8) {
    case BASE_TYPE_NONE:
      local_2aa = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_char>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&val_4);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2aa = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2aa & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_char>(pVStack_28,val_4);
      break;
    case BASE_TYPE_UTYPE:
      val_5._0_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)this,pcVar5,(Parser *)name,(uchar *)((long)&val_5 + 1));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_5._0_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if (((byte)val_5 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_char>(pVStack_28,val_5._1_1_);
      break;
    case BASE_TYPE_BOOL:
      local_2ae = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_char>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2ad);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2ae = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2ae & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_char>(pVStack_28,local_2ad);
      break;
    case BASE_TYPE_CHAR:
      val_6._0_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<signed_char>
                ((anon_unknown_0 *)this,pcVar5,(Parser *)name,(char *)((long)&val_6 + 1));
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_6._0_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if (((byte)val_6 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<signed_char>(pVStack_28,val_6._1_1_);
      break;
    case BASE_TYPE_UCHAR:
      local_2b2 = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_char>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2b1);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2b2 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2b2 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_char>(pVStack_28,local_2b1);
      break;
    case BASE_TYPE_SHORT:
      val_7._3_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<short>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2b4);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_7._3_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if ((val_7._3_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<short>(pVStack_28,local_2b4);
      break;
    case BASE_TYPE_USHORT:
      local_2b9 = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_short>
                ((anon_unknown_0 *)this,pcVar5,(Parser *)name,(unsigned_short *)&val_7);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2b9 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2b9 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_short>(pVStack_28,(unsigned_short)val_7);
      break;
    case BASE_TYPE_INT:
      local_2c1 = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<int>((anon_unknown_0 *)this,pcVar5,(Parser *)name,(int *)&val_8);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2c1 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2c1 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<int>(pVStack_28,val_8);
      break;
    case BASE_TYPE_UINT:
      val_9._7_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_int>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2c8);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_9._7_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if ((val_9._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_int>(pVStack_28,local_2c8);
      break;
    case BASE_TYPE_LONG:
      val_10._7_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<long>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2d8);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_10._7_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if ((val_10._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<long>(pVStack_28,local_2d8);
      break;
    case BASE_TYPE_ULONG:
      local_2e9 = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<unsigned_long>
                ((anon_unknown_0 *)this,pcVar5,(Parser *)name,(unsigned_long *)&val_11);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_2e9 = 1;
      }
      local_40 = (uint)bVar3;
      if ((local_2e9 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack<unsigned_long>(pVStack_28,_val_11);
      break;
    case BASE_TYPE_FLOAT:
      val_12._7_1_ = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<float>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_2f0);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        val_12._7_1_ = 1;
      }
      local_40 = (uint)bVar3;
      if ((val_12._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack(pVStack_28,local_2f0);
      break;
    case BASE_TYPE_DOUBLE:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::atot<double>((anon_unknown_0 *)this,pcVar5,(Parser *)name,&local_300);
      bVar3 = CheckedError::Check((CheckedError *)this);
      local_40 = (uint)bVar3;
      if (!bVar3) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_40 != 0) goto LAB_00113d1b;
      anon_unknown_0::SingleValueRepack(pVStack_28,local_300);
    }
  }
  anon_unknown_0::NoError();
LAB_00113d1b:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseSingleValue(const std::string *name, Value &e,
                                      bool check_now) {
  if (token_ == '+' || token_ == '-') {
    const char sign = static_cast<char>(token_);
    // Get an indentifier: NAN, INF, or function name like cos/sin/deg.
    NEXT();
    if (token_ != kTokenIdentifier) return Error("constant name expected");
    attribute_.insert(size_t(0), size_t(1), sign);
  }

  const auto in_type = e.type.base_type;
  const auto is_tok_ident = (token_ == kTokenIdentifier);
  const auto is_tok_string = (token_ == kTokenStringConstant);

  // First see if this could be a conversion function.
  if (is_tok_ident && *cursor_ == '(') { return ParseFunction(name, e); }

  // clang-format off
  auto match = false;

  #define IF_ECHECK_(force, dtoken, check, req)    \
    if (!match && ((dtoken) == token_) && ((check) || flatbuffers::IsConstTrue(force))) \
      ECHECK(TryTypedValue(name, dtoken, check, e, req, &match))
  #define TRY_ECHECK(dtoken, check, req) IF_ECHECK_(false, dtoken, check, req)
  #define FORCE_ECHECK(dtoken, check, req) IF_ECHECK_(true, dtoken, check, req)
  // clang-format on

  if (is_tok_ident || is_tok_string) {
    const auto kTokenStringOrIdent = token_;
    // The string type is a most probable type, check it first.
    TRY_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
               BASE_TYPE_STRING);

    // avoid escaped and non-ascii in the string
    if (!match && is_tok_string && IsScalar(in_type) &&
        !attr_is_trivial_ascii_string_) {
      return Error(
          std::string("type mismatch or invalid value, an initializer of "
                      "non-string field must be trivial ASCII string: type: ") +
          TypeName(in_type) + ", name: " + (name ? *name : "") +
          ", value: " + attribute_);
    }

    // A boolean as true/false. Boolean as Integer check below.
    if (!match && IsBool(in_type)) {
      auto is_true = attribute_ == "true";
      if (is_true || attribute_ == "false") {
        attribute_ = is_true ? "1" : "0";
        // accepts both kTokenStringConstant and kTokenIdentifier
        TRY_ECHECK(kTokenStringOrIdent, IsBool(in_type), BASE_TYPE_BOOL);
      }
    }
    // Check for optional scalars.
    if (!match && IsScalar(in_type) && attribute_ == "null") {
      e.constant = "null";
      NEXT();
      match = true;
    }
    // Check if this could be a string/identifier enum value.
    // Enum can have only true integer base type.
    if (!match && IsInteger(in_type) && !IsBool(in_type) &&
        IsIdentifierStart(*attribute_.c_str())) {
      ECHECK(ParseEnumFromString(e.type, &e.constant));
      NEXT();
      match = true;
    }
    // Parse a float/integer number from the string.
    // A "scalar-in-string" value needs extra checks.
    if (!match && is_tok_string && IsScalar(in_type)) {
      // Strip trailing whitespaces from attribute_.
      auto last_non_ws = attribute_.find_last_not_of(' ');
      if (std::string::npos != last_non_ws) attribute_.resize(last_non_ws + 1);
      if (IsFloat(e.type.base_type)) {
        // The functions strtod() and strtof() accept both 'nan' and
        // 'nan(number)' literals. While 'nan(number)' is rejected by the parser
        // as an unsupported function if is_tok_ident is true.
        if (attribute_.find_last_of(')') != std::string::npos) {
          return Error("invalid number: " + attribute_);
        }
      }
    }
    // Float numbers or nan, inf, pi, etc.
    TRY_ECHECK(kTokenStringOrIdent, IsFloat(in_type), BASE_TYPE_FLOAT);
    // An integer constant in string.
    TRY_ECHECK(kTokenStringOrIdent, IsInteger(in_type), BASE_TYPE_INT);
    // Unknown tokens will be interpreted as string type.
    // An attribute value may be a scalar or string constant.
    FORCE_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
                 BASE_TYPE_STRING);
  } else {
    // Try a float number.
    TRY_ECHECK(kTokenFloatConstant, IsFloat(in_type), BASE_TYPE_FLOAT);
    // Integer token can init any scalar (integer of float).
    FORCE_ECHECK(kTokenIntegerConstant, IsScalar(in_type), BASE_TYPE_INT);
  }
  // Match empty vectors for default-empty-vectors.
  if (!match && IsVector(e.type) && token_ == '[') {
    NEXT();
    if (token_ != ']') { return Error("Expected `]` in vector default"); }
    NEXT();
    match = true;
    e.constant = "[]";
  }

#undef FORCE_ECHECK
#undef TRY_ECHECK
#undef IF_ECHECK_

  if (!match) {
    std::string msg;
    msg += "Cannot assign token starting with '" + TokenToStringId(token_) +
           "' to value of <" + std::string(TypeName(in_type)) + "> type.";
    return Error(msg);
  }
  const auto match_type = e.type.base_type;  // may differ from in_type
  // The check_now flag must be true when parse a fbs-schema.
  // This flag forces to check default scalar values or metadata of field.
  // For JSON parser the flag should be false.
  // If it is set for JSON each value will be checked twice (see ParseTable).
  // Special case 'null' since atot can't handle that.
  if (check_now && IsScalar(match_type) && e.constant != "null") {
    // clang-format off
    switch (match_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
      case BASE_TYPE_ ## ENUM: {\
          CTYPE val; \
          ECHECK(atot(e.constant.c_str(), *this, &val)); \
          SingleValueRepack(e, val); \
        break; }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
  }
  return NoError();
}